

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_freeCCtxContent(ZSTD_CCtx *cctx)

{
  ZSTD_CCtx *cctx_local;
  
  ZSTD_free(cctx->workSpace,cctx->customMem);
  cctx->workSpace = (void *)0x0;
  ZSTD_freeCDict(cctx->cdictLocal);
  cctx->cdictLocal = (ZSTD_CDict *)0x0;
  return;
}

Assistant:

static void ZSTD_freeCCtxContent(ZSTD_CCtx* cctx)
{
    assert(cctx != NULL);
    assert(cctx->staticSize == 0);
    ZSTD_free(cctx->workSpace, cctx->customMem); cctx->workSpace = NULL;
    ZSTD_freeCDict(cctx->cdictLocal); cctx->cdictLocal = NULL;
#ifdef ZSTD_MULTITHREAD
    ZSTDMT_freeCCtx(cctx->mtctx); cctx->mtctx = NULL;
#endif
}